

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int rar_decode_byte(archive_read *a,uint8_t *byte)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  pvVar1 = a->format->data;
  iVar3 = *(int *)((long)pvVar1 + 0x4f38);
  if (iVar3 < 8) {
    iVar2 = rar_br_fillup(a,(rar_br *)((long)pvVar1 + 0x4f30));
    iVar3 = *(int *)((long)pvVar1 + 0x4f38);
    if (iVar3 < 8 && iVar2 == 0) {
      return 0;
    }
  }
  *byte = (uint8_t)(*(ulong *)((long)pvVar1 + 0x4f30) >> ((char)iVar3 - 8U & 0x3f));
  *(int *)((long)pvVar1 + 0x4f38) = *(int *)((long)pvVar1 + 0x4f38) + -8;
  return 1;
}

Assistant:

static int
rar_decode_byte(struct archive_read *a, uint8_t *byte)
{
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);
  if (!rar_br_read_ahead(a, br, 8))
    return 0;
  *byte = (uint8_t)rar_br_bits(br, 8);
  rar_br_consume(br, 8);
  return 1;
}